

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,short>
          (TryCast *this,string_t input,int16_t *result,bool strict)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  idx_t iVar11;
  short sVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  IntegerCastData<short> local_7c;
  IntegerCastData<short> local_7a;
  IntegerDecimalCastData<short> local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar23 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar23 = (long)&local_40 + 4;
  }
  if ((uint)this == 0) {
    return false;
  }
  bVar5 = SUB81(result,0);
  uVar24 = (ulong)this & 0xffffffff;
  uVar6 = 0;
  do {
    bVar2 = *(byte *)(lVar23 + uVar6);
    local_40 = this;
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
      local_7c.result = 0;
      if (bVar2 == 0x2d) {
        bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          ((char *)(lVar23 + uVar6),uVar24 - uVar6,&local_7c,bVar5);
      }
      else {
        if ((uVar24 - 1 != uVar6) && (bVar2 == 0x30)) {
          bVar2 = *(byte *)(lVar23 + 1 + uVar6);
          if (bVar2 < 0x62) {
            if (bVar2 == 0x42) {
LAB_0027a570:
              uVar8 = ~uVar6 + uVar24;
              if (1 < uVar8) {
                uVar13 = 1;
                local_78.result._0_2_ = 0;
                goto LAB_0027a58a;
              }
              break;
            }
            if (bVar2 == 0x58) {
LAB_0027a44d:
              uVar8 = ~uVar6 + uVar24;
              if (1 < uVar8) {
                uVar13 = 1;
                iVar9 = 0;
                goto LAB_0027a471;
              }
              break;
            }
          }
          else {
            if (bVar2 == 0x62) goto LAB_0027a570;
            if (bVar2 == 0x78) goto LAB_0027a44d;
          }
          if (((byte)(bVar2 - 0x30) < 10) && (bVar5 != false)) break;
        }
        bVar4 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          ((char *)(lVar23 + uVar6),uVar24 - uVar6,&local_7c,bVar5);
      }
      local_78.result._0_2_ = local_7c.result;
      if (bVar4 != false) goto LAB_0027ac78;
      break;
    }
    uVar6 = uVar6 + 1;
  } while (uVar24 != uVar6);
LAB_0027a62e:
  uVar6 = 0;
  while ((bVar2 = *(byte *)(lVar23 + uVar6), bVar2 - 9 < 5 || (bVar2 == 0x20))) {
    uVar6 = uVar6 + 1;
    if (uVar24 == uVar6) {
      return false;
    }
  }
  local_78.result = 0;
  local_78.decimal = 0;
  local_78._16_8_ = 0;
  uVar8 = uVar24 - uVar6;
  if (bVar2 == 0x2d) {
    if (uVar24 - 1 == uVar6) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>(&local_78);
      return false;
    }
    uVar13 = 1;
    local_78.result = 0;
    do {
      bVar2 = *(byte *)(uVar6 + uVar13 + lVar23);
      bVar18 = bVar2 - 0x30;
      if (9 < bVar18) {
        uVar10 = uVar13;
        if (bVar2 != 0x2e) goto LAB_0027aca6;
        if (bVar5 != false) {
          return false;
        }
        uVar22 = uVar13 + 1;
        uVar20 = uVar22;
        if (uVar8 <= uVar22) goto LAB_0027ad6d;
        local_78.decimal = 0;
        uVar19 = 0;
        uVar10 = uVar22;
        uVar17 = 0;
        goto LAB_0027aa7b;
      }
      uVar10 = (0x8000000000000000 - (ulong)bVar18) / 10;
      if (SBORROW8(local_78.result,-uVar10) != (long)(local_78.result + uVar10) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar18;
      uVar20 = uVar8;
      if (~uVar13 + uVar24 == uVar6) break;
      if (*(char *)(uVar6 + 1 + uVar13 + lVar23) == '_' && bVar5 == false) {
        if ((uVar24 - uVar13) - 2 == uVar6) {
          return false;
        }
        uVar13 = uVar13 + 2;
        if (9 < (byte)(*(char *)(uVar6 + lVar23 + uVar13) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar13 = uVar13 + 1;
      }
      uVar20 = uVar13;
    } while (uVar13 < uVar8);
    goto LAB_0027ab2f;
  }
  if ((uVar24 - 1 == uVar6) || (bVar2 != 0x30)) {
    if ((bVar2 == 0x2b & bVar5) != 0) {
      return false;
    }
    uVar13 = (ulong)(bVar2 == 0x2b);
LAB_0027a6df:
    if (uVar8 <= uVar13) goto LAB_0027aa2a;
    local_78.result = 0;
    uVar10 = uVar13;
    do {
      bVar2 = *(byte *)(uVar6 + uVar10 + lVar23);
      bVar18 = bVar2 - 0x30;
      if (9 < bVar18) {
        uVar22 = uVar10;
        if (bVar2 != 0x2e) goto LAB_0027adac;
        if (bVar5 != false) {
          return false;
        }
        local_50 = uVar10 + 1;
        uVar20 = local_50;
        if (uVar8 <= local_50) goto LAB_0027ae65;
        local_78.decimal = 0;
        local_60 = local_60 & 0xffffffff00000000;
        uVar17 = 0;
        uVar22 = local_50;
        goto LAB_0027ab94;
      }
      if ((long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar18;
      uVar20 = uVar8;
      if (~uVar10 + uVar24 == uVar6) break;
      if (*(char *)(uVar6 + 1 + uVar10 + lVar23) == '_' && bVar5 == false) {
        if ((uVar24 - uVar10) - 2 == uVar6) {
          return false;
        }
        uVar10 = uVar10 + 2;
        if (9 < (byte)(*(char *)(uVar6 + lVar23 + uVar10) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar10 = uVar10 + 1;
      }
      uVar20 = uVar10;
    } while (uVar10 < uVar8);
    goto LAB_0027ac54;
  }
  bVar2 = *(byte *)(lVar23 + 1 + uVar6);
  if (bVar2 < 0x62) {
    if (bVar2 != 0x42) {
      if (bVar2 != 0x58) {
LAB_0027a6b4:
        if (((byte)(bVar2 - 0x30) < 10 & bVar5) != 0) {
          return false;
        }
        uVar13 = 0;
        goto LAB_0027a6df;
      }
      goto LAB_0027a862;
    }
LAB_0027a983:
    uVar8 = ~uVar6 + uVar24;
    if (uVar8 < 2) goto LAB_0027aa2a;
    uVar13 = 1;
    local_78.result = 0;
    do {
      lVar1 = uVar13 + lVar23;
      cVar3 = *(char *)(uVar6 + 1 + lVar1);
      lVar7 = 0;
      if (cVar3 != '0') {
        if (cVar3 != '1') {
          return false;
        }
        lVar7 = 1;
      }
      uVar10 = uVar8;
      if ((uVar24 - uVar13) - 2 != uVar6) {
        if (*(char *)(uVar6 + 2 + lVar1) == '_') {
          if ((uVar24 - uVar13) - 3 == uVar6) {
            return false;
          }
          if ((*(byte *)(uVar6 + 3 + lVar1) & 0xfe) != 0x30) {
            return false;
          }
          uVar10 = uVar13 + 2;
        }
        else {
          uVar10 = uVar13 + 1;
        }
      }
      uVar13 = uVar10;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = lVar7 + local_78.result * 2;
    } while (uVar13 < uVar8);
  }
  else {
    if (bVar2 == 0x62) goto LAB_0027a983;
    if (bVar2 != 0x78) goto LAB_0027a6b4;
LAB_0027a862:
    uVar8 = ~uVar6 + uVar24;
    if (uVar8 < 2) {
LAB_0027aa2a:
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>(&local_78);
      return false;
    }
    uVar13 = 1;
    local_78.result = 0;
    do {
      lVar1 = uVar13 + lVar23;
      bVar2 = *(byte *)(uVar6 + 1 + lVar1);
      bVar18 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar18 = bVar2;
      }
      bVar2 = bVar18 - 0x30;
      if ((byte)(bVar18 + 0x9f) < 6 || bVar2 < 10) {
        bVar16 = bVar18 + 0xa9;
        if (bVar18 < 0x61) {
          bVar16 = bVar2;
        }
      }
      else {
        bVar16 = bVar2;
        if (5 < (byte)(bVar18 + 0xbf)) {
          return false;
        }
      }
      uVar10 = uVar8;
      if ((uVar24 - uVar13) - 2 != uVar6) {
        if (*(char *)(uVar6 + 2 + lVar1) == '_') {
          if ((uVar24 - uVar13) - 3 == uVar6) {
            return false;
          }
          bVar2 = *(byte *)(uVar6 + 3 + lVar1);
          uVar10 = uVar13 + 2;
          if (9 < (byte)(bVar2 - 0x30)) {
            uVar19 = bVar2 - 0x41;
            if (0x25 < uVar19) {
              return false;
            }
            if ((0x3f0000003fU >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
              return false;
            }
          }
        }
        else {
          uVar10 = uVar13 + 1;
        }
      }
      uVar13 = uVar10;
      if ((long)((ulong)(bVar16 >> 4) ^ 0x7ffffffffffffff) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 0x10 + (ulong)bVar16;
    } while (uVar13 < uVar8);
  }
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_78);
LAB_0027aa21:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_0027ac73;
  while( true ) {
    uVar10 = uVar8;
    if ((uVar24 - uVar13) - 2 != uVar6) {
      if (*(char *)(uVar6 + 2 + lVar1) == '_') {
        if (((uVar24 - uVar13) - 3 == uVar6) || ((*(byte *)(uVar6 + 3 + lVar1) & 0xfe) != 0x30))
        goto LAB_0027a62e;
        uVar10 = uVar13 + 2;
      }
      else {
        uVar10 = uVar13 + 1;
      }
    }
    uVar13 = uVar10;
    if (0x3fff < local_78.result._0_2_) goto LAB_0027a62e;
    local_78.result._0_2_ = sVar12 + local_78.result._0_2_ * 2;
    if (uVar8 <= uVar13) break;
LAB_0027a58a:
    lVar1 = uVar13 + lVar23;
    cVar3 = *(char *)(uVar6 + 1 + lVar1);
    local_7c.result = local_78.result._0_2_;
    if (cVar3 == '0') {
      sVar12 = 0;
    }
    else {
      if (cVar3 != '1') goto LAB_0027a62e;
      sVar12 = 1;
    }
  }
  goto LAB_0027ac78;
LAB_0027a471:
  do {
    lVar1 = uVar13 + lVar23;
    bVar2 = *(byte *)(uVar6 + 1 + lVar1);
    bVar18 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar18 = bVar2;
    }
    uVar19 = bVar18 - 0x30;
    local_7c.result = (ResultType_conflict)iVar9;
    if ((byte)(bVar18 + 0x9f) < 6 || (byte)uVar19 < 10) {
      uVar15 = bVar18 - 0x57;
      if (bVar18 < 0x61) {
        uVar15 = uVar19;
      }
      uVar19 = uVar15 & 0xff;
    }
    else if (5 < (byte)(bVar18 + 0xbf)) goto LAB_0027a62e;
    uVar10 = uVar8;
    if ((uVar24 - uVar13) - 2 != uVar6) {
      if (*(char *)(uVar6 + 2 + lVar1) == '_') {
        if ((uVar24 - uVar13) - 3 == uVar6) goto LAB_0027a62e;
        bVar2 = *(byte *)(uVar6 + 3 + lVar1);
        uVar10 = uVar13 + 2;
        if ((9 < (byte)(bVar2 - 0x30)) &&
           ((uVar15 = bVar2 - 0x41, 0x25 < uVar15 ||
            ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0)))) goto LAB_0027a62e;
      }
      else {
        uVar10 = uVar13 + 1;
      }
    }
    uVar13 = uVar10;
    if ((int)(uVar19 >> 4 & 0xf ^ 0x7ff) < (int)local_7c.result) goto LAB_0027a62e;
    iVar9 = iVar9 * 0x10 + (uVar19 & 0xff);
  } while (uVar13 < uVar8);
  local_78.result._0_2_ = (ResultType_conflict)iVar9;
  goto LAB_0027ac78;
LAB_0027aa7b:
  uVar21 = uVar17;
  bVar2 = *(byte *)(uVar6 + uVar10 + lVar23);
  bVar18 = bVar2 - 0x30;
  local_58 = uVar22;
  if (9 < bVar18) {
    local_78._16_8_ = uVar21 & 0xffff;
    if (uVar10 <= uVar22 && uVar13 < 2) {
      return false;
    }
LAB_0027aca6:
    uVar19 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar19 - 9) {
        return false;
      }
LAB_0027acbc:
      uVar10 = uVar10 + 1;
      uVar20 = uVar10;
      if (uVar10 < uVar8) {
        do {
          bVar2 = *(byte *)(uVar6 + lVar23 + uVar10);
          if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
            return false;
          }
          uVar10 = uVar10 + 1;
          uVar20 = uVar8;
        } while (uVar8 != uVar10);
      }
      goto LAB_0027ab2f;
    }
    if ((bVar2 != 0x65) && (uVar19 != 0x45)) {
      if (uVar19 != 0x20) {
        return false;
      }
      goto LAB_0027acbc;
    }
    if (uVar10 == 1 || bVar5 != false) {
      return false;
    }
    if (uVar8 <= uVar10 + 1) {
      return false;
    }
    local_7a.result = 0;
    pcVar14 = (char *)(uVar6 + lVar23 + uVar10 + 1);
    iVar11 = ~uVar6 + (uVar24 - uVar10);
    if (*pcVar14 == '-') {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar11,&local_7a,false);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar11,&local_7a,false);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                      (&local_78,local_7a.result);
    goto LAB_0027aa21;
  }
  uVar17 = uVar21;
  if (local_78.decimal <= (long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10)) {
    uVar19 = uVar19 + 1;
    local_78.decimal = local_78.decimal * 10 + (ulong)bVar18;
    uVar17 = (ulong)uVar19;
  }
  uVar20 = uVar8;
  local_60 = uVar21;
  if (~uVar10 + uVar24 != uVar6) goto code_r0x0027aadb;
  goto LAB_0027ad5d;
code_r0x0027aadb:
  if (*(char *)(uVar6 + 1 + uVar10 + lVar23) == '_') {
    if ((uVar24 - uVar10) - 2 == uVar6) {
      return false;
    }
    uVar10 = uVar10 + 2;
    if (9 < (byte)(*(char *)(uVar6 + lVar23 + uVar10) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar10 = uVar10 + 1;
  }
  uVar20 = uVar10;
  if (uVar8 <= uVar10) goto LAB_0027ad5d;
  goto LAB_0027aa7b;
LAB_0027ad5d:
  local_78._16_8_ = uVar17 & 0xffff;
LAB_0027ad6d:
  if ((uVar13 < 2) && (uVar20 <= uVar22)) {
    return false;
  }
LAB_0027ab2f:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    (&local_78);
  if (!bVar5) {
    return false;
  }
  if (uVar20 < 2) {
    return false;
  }
  goto LAB_0027ac73;
LAB_0027ab94:
  local_48 = uVar17;
  local_58 = lVar23 + uVar22;
  bVar2 = *(byte *)(uVar6 + local_58);
  bVar18 = bVar2 - 0x30;
  if (9 < bVar18) {
    local_78._16_8_ = local_48 & 0xffff;
    if (uVar22 <= local_50 && uVar10 <= uVar13) {
      return false;
    }
LAB_0027adac:
    uVar19 = (uint)bVar2;
    if (bVar2 < 0x20) {
      if (4 < uVar19 - 9) {
        return false;
      }
LAB_0027adc2:
      uVar22 = uVar22 + 1;
      uVar20 = uVar22;
      if (uVar22 < uVar8) {
        do {
          bVar2 = *(byte *)(uVar6 + lVar23 + uVar22);
          if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
            return false;
          }
          uVar22 = uVar22 + 1;
          uVar20 = uVar8;
        } while (uVar8 != uVar22);
      }
      goto LAB_0027ac54;
    }
    if ((bVar2 != 0x65) && (uVar19 != 0x45)) {
      if (uVar19 != 0x20) {
        return false;
      }
      goto LAB_0027adc2;
    }
    if (uVar22 == uVar13 || bVar5 != false) {
      return false;
    }
    if (uVar8 <= uVar22 + 1) {
      return false;
    }
    local_7a.result = 0;
    pcVar14 = (char *)(uVar6 + lVar23 + uVar22 + 1);
    iVar11 = ~uVar6 + (uVar24 - uVar22);
    if (*pcVar14 == '-') {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar11,&local_7a,false);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar11,&local_7a,false);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                      (&local_78,local_7a.result);
    goto LAB_0027aa21;
  }
  uVar17 = local_48;
  uVar19 = (uint)local_60;
  if (local_78.decimal <= (long)(((ulong)bVar18 ^ 0x7ffffffffffffffe) / 10)) {
    local_78.decimal = (ulong)bVar18 + local_78.decimal * 10;
    uVar17 = (ulong)((uint)local_60 + 1);
    uVar19 = (uint)local_60 + 1;
  }
  uVar20 = uVar8;
  if (~uVar22 + uVar24 != uVar6) goto code_r0x0027abf2;
  goto LAB_0027ae5a;
code_r0x0027abf2:
  if (*(char *)(uVar6 + 1 + local_58) == '_') {
    if ((uVar24 - uVar22) - 2 == uVar6) {
      return false;
    }
    uVar22 = uVar22 + 2;
    if (9 < (byte)(*(char *)(uVar6 + lVar23 + uVar22) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar22 = uVar22 + 1;
  }
  local_60 = CONCAT44(local_60._4_4_,uVar19);
  uVar20 = uVar22;
  if (uVar8 <= uVar22) goto LAB_0027ae5a;
  goto LAB_0027ab94;
LAB_0027ae5a:
  local_78._16_8_ = uVar17 & 0xffff;
LAB_0027ae65:
  if ((uVar10 <= uVar13) && (uVar20 <= local_50)) {
    return false;
  }
LAB_0027ac54:
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_78);
  if (!bVar5) {
    return false;
  }
  if (uVar20 <= uVar13) {
    return false;
  }
LAB_0027ac73:
LAB_0027ac78:
  *input.value._8_8_ = local_78.result._0_2_;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, int16_t &result, bool strict) {
	return TrySimpleIntegerCast<int16_t>(input.GetData(), input.GetSize(), result, strict);
}